

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O0

void QGraphicsSceneBspTreeIndexPrivate::sortItems
               (QList<QGraphicsItem_*> *itemList,SortOrder order,bool sortCacheEnabled,
               bool onlyTopLevelItems)

{
  iterator __first;
  iterator __last;
  byte in_CL;
  byte in_DL;
  int in_ESI;
  _func_bool_QGraphicsItem_ptr_QGraphicsItem_ptr *in_stack_ffffffffffffff88;
  QList<QGraphicsItem_*> *in_stack_ffffffffffffff90;
  iterator in_stack_ffffffffffffffa0;
  iterator in_stack_ffffffffffffffa8;
  
  if (in_ESI != -1) {
    if ((in_CL & 1) == 0) {
      if ((in_DL & 1) == 0) {
        if (in_ESI == 1) {
          __first = QList<QGraphicsItem_*>::begin(in_stack_ffffffffffffff90);
          __last = QList<QGraphicsItem_*>::end(in_stack_ffffffffffffff90);
          std::
          sort<QList<QGraphicsItem*>::iterator,bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>
                    (__first,__last,in_stack_ffffffffffffff88);
        }
        else if (in_ESI == 0) {
          QList<QGraphicsItem_*>::begin(in_stack_ffffffffffffff90);
          QList<QGraphicsItem_*>::end(in_stack_ffffffffffffff90);
          std::
          sort<QList<QGraphicsItem*>::iterator,bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff88);
        }
      }
      else if (in_ESI == 1) {
        QList<QGraphicsItem_*>::begin(in_stack_ffffffffffffff90);
        QList<QGraphicsItem_*>::end(in_stack_ffffffffffffff90);
        std::
        sort<QList<QGraphicsItem*>::iterator,bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff88);
      }
      else if (in_ESI == 0) {
        QList<QGraphicsItem_*>::begin(in_stack_ffffffffffffff90);
        QList<QGraphicsItem_*>::end(in_stack_ffffffffffffff90);
        std::
        sort<QList<QGraphicsItem*>::iterator,bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff88);
      }
    }
    else if (in_ESI == 1) {
      QList<QGraphicsItem_*>::begin(in_stack_ffffffffffffff90);
      QList<QGraphicsItem_*>::end(in_stack_ffffffffffffff90);
      std::sort<QList<QGraphicsItem*>::iterator,bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff88);
    }
    else if (in_ESI == 0) {
      QList<QGraphicsItem_*>::begin(in_stack_ffffffffffffff90);
      QList<QGraphicsItem_*>::end(in_stack_ffffffffffffff90);
      std::sort<QList<QGraphicsItem*>::iterator,bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff88);
    }
  }
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::sortItems(QList<QGraphicsItem *> *itemList, Qt::SortOrder order,
                                                  bool sortCacheEnabled, bool onlyTopLevelItems)
{
    if (order == Qt::SortOrder(-1))
        return;

    if (onlyTopLevelItems) {
        if (order == Qt::DescendingOrder)
            std::sort(itemList->begin(), itemList->end(), qt_closestLeaf);
        else if (order == Qt::AscendingOrder)
            std::sort(itemList->begin(), itemList->end(), qt_notclosestLeaf);
        return;
    }

    if (sortCacheEnabled) {
        if (order == Qt::DescendingOrder) {
            std::sort(itemList->begin(), itemList->end(), closestItemFirst_withCache);
        } else if (order == Qt::AscendingOrder) {
            std::sort(itemList->begin(), itemList->end(), closestItemLast_withCache);
        }
    } else {
        if (order == Qt::DescendingOrder) {
            std::sort(itemList->begin(), itemList->end(), qt_closestItemFirst);
        } else if (order == Qt::AscendingOrder) {
            std::sort(itemList->begin(), itemList->end(), qt_closestItemLast);
        }
    }
}